

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

void ggml_numa_init(ggml_numa_strategy numa_flag)

{
  uint uVar1;
  int iVar2;
  pthread_t __th;
  FILE *__stream;
  char *pcVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint current_cpu;
  char buf [42];
  stat st;
  char path [256];
  
  if (g_state.numa.n_nodes != 0) {
    fwrite("ggml_numa_init: NUMA already initialized\n",0x29,1,_stderr);
    return;
  }
  g_state.numa.numa_strategy = numa_flag;
  __th = pthread_self();
  path[0] = '\0';
  path[1] = '\0';
  path[2] = '\0';
  path[3] = '\0';
  path[4] = '\0';
  path[5] = '\0';
  path[6] = '\0';
  path[7] = '\0';
  path[8] = '\0';
  path[9] = '\0';
  path[10] = '\0';
  path[0xb] = '\0';
  path[0xc] = '\0';
  path[0xd] = '\0';
  path[0xe] = '\0';
  path[0xf] = '\0';
  path[0x10] = '\0';
  path[0x11] = '\0';
  path[0x12] = '\0';
  path[0x13] = '\0';
  path[0x14] = '\0';
  path[0x15] = '\0';
  path[0x16] = '\0';
  path[0x17] = '\0';
  path[0x18] = '\0';
  path[0x19] = '\0';
  path[0x1a] = '\0';
  path[0x1b] = '\0';
  path[0x1c] = '\0';
  path[0x1d] = '\0';
  path[0x1e] = '\0';
  path[0x1f] = '\0';
  path[0x20] = '\0';
  path[0x21] = '\0';
  path[0x22] = '\0';
  path[0x23] = '\0';
  path[0x24] = '\0';
  path[0x25] = '\0';
  path[0x26] = '\0';
  path[0x27] = '\0';
  path[0x28] = '\0';
  path[0x29] = '\0';
  path[0x2a] = '\0';
  path[0x2b] = '\0';
  path[0x2c] = '\0';
  path[0x2d] = '\0';
  path[0x2e] = '\0';
  path[0x2f] = '\0';
  path[0x30] = '\0';
  path[0x31] = '\0';
  path[0x32] = '\0';
  path[0x33] = '\0';
  path[0x34] = '\0';
  path[0x35] = '\0';
  path[0x36] = '\0';
  path[0x37] = '\0';
  path[0x38] = '\0';
  path[0x39] = '\0';
  path[0x3a] = '\0';
  path[0x3b] = '\0';
  path[0x3c] = '\0';
  path[0x3d] = '\0';
  path[0x3e] = '\0';
  path[0x3f] = '\0';
  path[0x40] = '\0';
  path[0x41] = '\0';
  path[0x42] = '\0';
  path[0x43] = '\0';
  path[0x44] = '\0';
  path[0x45] = '\0';
  path[0x46] = '\0';
  path[0x47] = '\0';
  path[0x48] = '\0';
  path[0x49] = '\0';
  path[0x4a] = '\0';
  path[0x4b] = '\0';
  path[0x4c] = '\0';
  path[0x4d] = '\0';
  path[0x4e] = '\0';
  path[0x4f] = '\0';
  path[0x50] = '\0';
  path[0x51] = '\0';
  path[0x52] = '\0';
  path[0x53] = '\0';
  path[0x54] = '\0';
  path[0x55] = '\0';
  path[0x56] = '\0';
  path[0x57] = '\0';
  path[0x58] = '\0';
  path[0x59] = '\0';
  path[0x5a] = '\0';
  path[0x5b] = '\0';
  path[0x5c] = '\0';
  path[0x5d] = '\0';
  path[0x5e] = '\0';
  path[0x5f] = '\0';
  path[0x60] = '\0';
  path[0x61] = '\0';
  path[0x62] = '\0';
  path[99] = '\0';
  path[100] = '\0';
  path[0x65] = '\0';
  path[0x66] = '\0';
  path[0x67] = '\0';
  path[0x68] = '\0';
  path[0x69] = '\0';
  path[0x6a] = '\0';
  path[0x6b] = '\0';
  path[0x6c] = '\0';
  path[0x6d] = '\0';
  path[0x6e] = '\0';
  path[0x6f] = '\0';
  path[0x70] = '\0';
  path[0x71] = '\0';
  path[0x72] = '\0';
  path[0x73] = '\0';
  path[0x74] = '\0';
  path[0x75] = '\0';
  path[0x76] = '\0';
  path[0x77] = '\0';
  path[0x78] = '\0';
  path[0x79] = '\0';
  path[0x7a] = '\0';
  path[0x7b] = '\0';
  path[0x7c] = '\0';
  path[0x7d] = '\0';
  path[0x7e] = '\0';
  path[0x7f] = '\0';
  pthread_getaffinity_np(__th,0x80,(cpu_set_t *)path);
  g_state.numa.cpuset.__bits[0]._0_1_ = path[0];
  g_state.numa.cpuset.__bits[0]._1_1_ = path[1];
  g_state.numa.cpuset.__bits[0]._2_1_ = path[2];
  g_state.numa.cpuset.__bits[0]._3_1_ = path[3];
  g_state.numa.cpuset.__bits[0]._4_1_ = path[4];
  g_state.numa.cpuset.__bits[0]._5_1_ = path[5];
  g_state.numa.cpuset.__bits[0]._6_1_ = path[6];
  g_state.numa.cpuset.__bits[0]._7_1_ = path[7];
  g_state.numa.cpuset.__bits[1]._0_1_ = path[8];
  g_state.numa.cpuset.__bits[1]._1_1_ = path[9];
  g_state.numa.cpuset.__bits[1]._2_1_ = path[10];
  g_state.numa.cpuset.__bits[1]._3_1_ = path[0xb];
  g_state.numa.cpuset.__bits[1]._4_1_ = path[0xc];
  g_state.numa.cpuset.__bits[1]._5_1_ = path[0xd];
  g_state.numa.cpuset.__bits[1]._6_1_ = path[0xe];
  g_state.numa.cpuset.__bits[1]._7_1_ = path[0xf];
  g_state.numa.cpuset.__bits[2]._0_1_ = path[0x10];
  g_state.numa.cpuset.__bits[2]._1_1_ = path[0x11];
  g_state.numa.cpuset.__bits[2]._2_1_ = path[0x12];
  g_state.numa.cpuset.__bits[2]._3_1_ = path[0x13];
  g_state.numa.cpuset.__bits[2]._4_1_ = path[0x14];
  g_state.numa.cpuset.__bits[2]._5_1_ = path[0x15];
  g_state.numa.cpuset.__bits[2]._6_1_ = path[0x16];
  g_state.numa.cpuset.__bits[2]._7_1_ = path[0x17];
  g_state.numa.cpuset.__bits[3]._0_1_ = path[0x18];
  g_state.numa.cpuset.__bits[3]._1_1_ = path[0x19];
  g_state.numa.cpuset.__bits[3]._2_1_ = path[0x1a];
  g_state.numa.cpuset.__bits[3]._3_1_ = path[0x1b];
  g_state.numa.cpuset.__bits[3]._4_1_ = path[0x1c];
  g_state.numa.cpuset.__bits[3]._5_1_ = path[0x1d];
  g_state.numa.cpuset.__bits[3]._6_1_ = path[0x1e];
  g_state.numa.cpuset.__bits[3]._7_1_ = path[0x1f];
  g_state.numa.cpuset.__bits[4]._0_1_ = path[0x20];
  g_state.numa.cpuset.__bits[4]._1_1_ = path[0x21];
  g_state.numa.cpuset.__bits[4]._2_1_ = path[0x22];
  g_state.numa.cpuset.__bits[4]._3_1_ = path[0x23];
  g_state.numa.cpuset.__bits[4]._4_1_ = path[0x24];
  g_state.numa.cpuset.__bits[4]._5_1_ = path[0x25];
  g_state.numa.cpuset.__bits[4]._6_1_ = path[0x26];
  g_state.numa.cpuset.__bits[4]._7_1_ = path[0x27];
  g_state.numa.cpuset.__bits[5]._0_1_ = path[0x28];
  g_state.numa.cpuset.__bits[5]._1_1_ = path[0x29];
  g_state.numa.cpuset.__bits[5]._2_1_ = path[0x2a];
  g_state.numa.cpuset.__bits[5]._3_1_ = path[0x2b];
  g_state.numa.cpuset.__bits[5]._4_1_ = path[0x2c];
  g_state.numa.cpuset.__bits[5]._5_1_ = path[0x2d];
  g_state.numa.cpuset.__bits[5]._6_1_ = path[0x2e];
  g_state.numa.cpuset.__bits[5]._7_1_ = path[0x2f];
  g_state.numa.cpuset.__bits[6]._0_1_ = path[0x30];
  g_state.numa.cpuset.__bits[6]._1_1_ = path[0x31];
  g_state.numa.cpuset.__bits[6]._2_1_ = path[0x32];
  g_state.numa.cpuset.__bits[6]._3_1_ = path[0x33];
  g_state.numa.cpuset.__bits[6]._4_1_ = path[0x34];
  g_state.numa.cpuset.__bits[6]._5_1_ = path[0x35];
  g_state.numa.cpuset.__bits[6]._6_1_ = path[0x36];
  g_state.numa.cpuset.__bits[6]._7_1_ = path[0x37];
  g_state.numa.cpuset.__bits[7]._0_1_ = path[0x38];
  g_state.numa.cpuset.__bits[7]._1_1_ = path[0x39];
  g_state.numa.cpuset.__bits[7]._2_1_ = path[0x3a];
  g_state.numa.cpuset.__bits[7]._3_1_ = path[0x3b];
  g_state.numa.cpuset.__bits[7]._4_1_ = path[0x3c];
  g_state.numa.cpuset.__bits[7]._5_1_ = path[0x3d];
  g_state.numa.cpuset.__bits[7]._6_1_ = path[0x3e];
  g_state.numa.cpuset.__bits[7]._7_1_ = path[0x3f];
  g_state.numa.cpuset.__bits[8]._0_1_ = path[0x40];
  g_state.numa.cpuset.__bits[8]._1_1_ = path[0x41];
  g_state.numa.cpuset.__bits[8]._2_1_ = path[0x42];
  g_state.numa.cpuset.__bits[8]._3_1_ = path[0x43];
  g_state.numa.cpuset.__bits[8]._4_1_ = path[0x44];
  g_state.numa.cpuset.__bits[8]._5_1_ = path[0x45];
  g_state.numa.cpuset.__bits[8]._6_1_ = path[0x46];
  g_state.numa.cpuset.__bits[8]._7_1_ = path[0x47];
  g_state.numa.cpuset.__bits[9]._0_1_ = path[0x48];
  g_state.numa.cpuset.__bits[9]._1_1_ = path[0x49];
  g_state.numa.cpuset.__bits[9]._2_1_ = path[0x4a];
  g_state.numa.cpuset.__bits[9]._3_1_ = path[0x4b];
  g_state.numa.cpuset.__bits[9]._4_1_ = path[0x4c];
  g_state.numa.cpuset.__bits[9]._5_1_ = path[0x4d];
  g_state.numa.cpuset.__bits[9]._6_1_ = path[0x4e];
  g_state.numa.cpuset.__bits[9]._7_1_ = path[0x4f];
  g_state.numa.cpuset.__bits[10]._0_1_ = path[0x50];
  g_state.numa.cpuset.__bits[10]._1_1_ = path[0x51];
  g_state.numa.cpuset.__bits[10]._2_1_ = path[0x52];
  g_state.numa.cpuset.__bits[10]._3_1_ = path[0x53];
  g_state.numa.cpuset.__bits[10]._4_1_ = path[0x54];
  g_state.numa.cpuset.__bits[10]._5_1_ = path[0x55];
  g_state.numa.cpuset.__bits[10]._6_1_ = path[0x56];
  g_state.numa.cpuset.__bits[10]._7_1_ = path[0x57];
  g_state.numa.cpuset.__bits[0xb]._0_1_ = path[0x58];
  g_state.numa.cpuset.__bits[0xb]._1_1_ = path[0x59];
  g_state.numa.cpuset.__bits[0xb]._2_1_ = path[0x5a];
  g_state.numa.cpuset.__bits[0xb]._3_1_ = path[0x5b];
  g_state.numa.cpuset.__bits[0xb]._4_1_ = path[0x5c];
  g_state.numa.cpuset.__bits[0xb]._5_1_ = path[0x5d];
  g_state.numa.cpuset.__bits[0xb]._6_1_ = path[0x5e];
  g_state.numa.cpuset.__bits[0xb]._7_1_ = path[0x5f];
  g_state.numa.cpuset.__bits[0xc]._0_1_ = path[0x60];
  g_state.numa.cpuset.__bits[0xc]._1_1_ = path[0x61];
  g_state.numa.cpuset.__bits[0xc]._2_1_ = path[0x62];
  g_state.numa.cpuset.__bits[0xc]._3_1_ = path[99];
  g_state.numa.cpuset.__bits[0xc]._4_1_ = path[100];
  g_state.numa.cpuset.__bits[0xc]._5_1_ = path[0x65];
  g_state.numa.cpuset.__bits[0xc]._6_1_ = path[0x66];
  g_state.numa.cpuset.__bits[0xc]._7_1_ = path[0x67];
  g_state.numa.cpuset.__bits[0xd]._0_1_ = path[0x68];
  g_state.numa.cpuset.__bits[0xd]._1_1_ = path[0x69];
  g_state.numa.cpuset.__bits[0xd]._2_1_ = path[0x6a];
  g_state.numa.cpuset.__bits[0xd]._3_1_ = path[0x6b];
  g_state.numa.cpuset.__bits[0xd]._4_1_ = path[0x6c];
  g_state.numa.cpuset.__bits[0xd]._5_1_ = path[0x6d];
  g_state.numa.cpuset.__bits[0xd]._6_1_ = path[0x6e];
  g_state.numa.cpuset.__bits[0xd]._7_1_ = path[0x6f];
  g_state.numa.cpuset.__bits[0xe]._0_1_ = path[0x70];
  g_state.numa.cpuset.__bits[0xe]._1_1_ = path[0x71];
  g_state.numa.cpuset.__bits[0xe]._2_1_ = path[0x72];
  g_state.numa.cpuset.__bits[0xe]._3_1_ = path[0x73];
  g_state.numa.cpuset.__bits[0xe]._4_1_ = path[0x74];
  g_state.numa.cpuset.__bits[0xe]._5_1_ = path[0x75];
  g_state.numa.cpuset.__bits[0xe]._6_1_ = path[0x76];
  g_state.numa.cpuset.__bits[0xe]._7_1_ = path[0x77];
  g_state.numa.cpuset.__bits[0xf]._0_1_ = path[0x78];
  g_state.numa.cpuset.__bits[0xf]._1_1_ = path[0x79];
  g_state.numa.cpuset.__bits[0xf]._2_1_ = path[0x7a];
  g_state.numa.cpuset.__bits[0xf]._3_1_ = path[0x7b];
  g_state.numa.cpuset.__bits[0xf]._4_1_ = path[0x7c];
  g_state.numa.cpuset.__bits[0xf]._5_1_ = path[0x7d];
  g_state.numa.cpuset.__bits[0xf]._6_1_ = path[0x7e];
  g_state.numa.cpuset.__bits[0xf]._7_1_ = path[0x7f];
  for (; g_state.numa.n_nodes < 8; g_state.numa.n_nodes = g_state.numa.n_nodes + 1) {
    iVar2 = snprintf(path,0x100,"/sys/devices/system/node/node%u");
    if (0xfe < iVar2 - 1U) {
      uVar7 = 0x25c;
      goto LAB_0010c859;
    }
    iVar2 = stat(path,(stat *)&st);
    if (iVar2 != 0) break;
  }
  for (; g_state.numa.total_cpus < 0x200; g_state.numa.total_cpus = g_state.numa.total_cpus + 1) {
    iVar2 = snprintf(path,0x100,"/sys/devices/system/cpu/cpu%u");
    if (0xfe < iVar2 - 1U) {
      uVar7 = 0x264;
LAB_0010c859:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,uVar7,"GGML_ASSERT(%s) failed","rv > 0 && (unsigned)rv < sizeof(path)");
    }
    iVar2 = stat(path,(stat *)&st);
    if (iVar2 != 0) break;
  }
  iVar2 = getcpu(&current_cpu,0x15daa4);
  if (((g_state.numa.n_nodes == 0) || (g_state.numa.total_cpus == 0)) || (iVar2 != 0)) {
    g_state.numa.n_nodes = 0;
    return;
  }
  uVar8 = 0;
  uVar4 = g_state.numa.total_cpus;
  do {
    if (g_state.numa.n_nodes <= uVar8) {
      if (g_state.numa.n_nodes < 2) {
        return;
      }
      __stream = fopen("/proc/sys/kernel/numa_balancing","r");
      if (__stream == (FILE *)0x0) {
        return;
      }
      pcVar3 = fgets(buf,0x2a,__stream);
      if ((pcVar3 != (char *)0x0) && (iVar2 = bcmp(buf,"0\n",3), iVar2 != 0)) {
        ggml_log_internal(3,
                          "/proc/sys/kernel/numa_balancing is enabled, this has been observed to impair performance\n"
                         );
      }
      fclose(__stream);
      return;
    }
    g_state.numa.nodes[uVar8].n_cpus = 0;
    uVar6 = 0;
    while (uVar5 = (uint)uVar6, uVar5 < uVar4) {
      iVar2 = snprintf(path,0x100,"/sys/devices/system/node/node%u/cpu%u",uVar8 & 0xffffffff,uVar6);
      if (0xfe < iVar2 - 1U) {
        uVar7 = 0x285;
        goto LAB_0010c859;
      }
      iVar2 = stat(path,(stat *)&st);
      if (iVar2 == 0) {
        uVar1 = g_state.numa.nodes[uVar8].n_cpus;
        g_state.numa.nodes[uVar8].n_cpus = uVar1 + 1;
        *(uint *)(uVar8 * 0x804 + 0x159a7c + (ulong)uVar1 * 4) = uVar5;
      }
      uVar4 = g_state.numa.total_cpus;
      uVar6 = (ulong)(uVar5 + 1);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void ggml_numa_init(enum ggml_numa_strategy numa_flag) {
    if (g_state.numa.n_nodes > 0) {
        fprintf(stderr, "ggml_numa_init: NUMA already initialized\n");

        return;
    }

#if defined(__gnu_linux__)
    struct stat st;
    char path[256];
    int rv;

    // set numa scheme
    g_state.numa.numa_strategy = numa_flag;

    GGML_PRINT_DEBUG("numa strategy %u\n",g_state.numa.numa_strategy);

    g_state.numa.cpuset = ggml_get_numa_affinity();

    // enumerate nodes
    while (g_state.numa.n_nodes < GGML_NUMA_MAX_NODES) {
        rv = snprintf(path, sizeof(path), "/sys/devices/system/node/node%u", g_state.numa.n_nodes);
        GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
        if (stat(path, &st) != 0) { break; }
        ++g_state.numa.n_nodes;
    }

    // enumerate CPUs
    while (g_state.numa.total_cpus < GGML_NUMA_MAX_CPUS) {
        rv = snprintf(path, sizeof(path), "/sys/devices/system/cpu/cpu%u", g_state.numa.total_cpus);
        GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
        if (stat(path, &st) != 0) { break; }
        ++g_state.numa.total_cpus;
    }

    GGML_PRINT_DEBUG("found %u numa nodes, %u CPUs\n", g_state.numa.n_nodes, g_state.numa.total_cpus);

    // figure out which node we're on
    uint current_cpu;
    int getcpu_ret = 0;
#if __GLIBC__ > 2 || (__GLIBC__ == 2 && __GLIBC_MINOR__ > 33) || defined(__COSMOPOLITAN__)
    getcpu_ret = getcpu(&current_cpu, &g_state.numa.current_node);
#else
    // old glibc doesn't have a wrapper for this call. Fall back on direct syscall
#   if !defined(SYS_getcpu) && defined(SYS_get_cpu)
#       define SYS_getcpu SYS_get_cpu // some older glibc versions use this name
#   endif
    getcpu_ret = syscall(SYS_getcpu, &current_cpu, &g_state.numa.current_node);
#endif

    if (g_state.numa.n_nodes < 1 || g_state.numa.total_cpus < 1 || getcpu_ret != 0) {
        g_state.numa.n_nodes = 0;
        return;
    }

    GGML_PRINT_DEBUG("found our process on numa node %u, CPU %u\n", g_state.numa.current_node, current_cpu);

    for (uint32_t n = 0; n < g_state.numa.n_nodes; ++n) {
        struct ggml_numa_node * node = &g_state.numa.nodes[n];
        GGML_PRINT_DEBUG("CPUs on node %u:", n);
        node->n_cpus = 0;
        for (uint32_t c = 0; c < g_state.numa.total_cpus; ++c) {
            rv = snprintf(path, sizeof(path), "/sys/devices/system/node/node%u/cpu%u", n, c);
            GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
            if (stat(path, &st) == 0) {
                node->cpus[node->n_cpus++] = c;
                GGML_PRINT_DEBUG(" %u", c);
            }
        }
        GGML_PRINT_DEBUG("\n");
    }

    if (ggml_is_numa()) {
        FILE *fptr = fopen("/proc/sys/kernel/numa_balancing", "r");
        if (fptr != NULL) {
            char buf[42];
            if (fgets(buf, sizeof(buf), fptr) && strncmp(buf, "0\n", sizeof(buf)) != 0) {
                GGML_LOG_WARN("/proc/sys/kernel/numa_balancing is enabled, this has been observed to impair performance\n");
            }
            fclose(fptr);
        }
    }
#else
    UNUSED(numa_flag);
    // TODO
#endif
}